

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTSynthetic.cpp
# Opt level: O3

bool __thiscall SyntheticConnection::ProcessFetchedData(SyntheticConnection *this)

{
  _Base_ptr *pos;
  double dVar1;
  int iVar2;
  time_t tVar3;
  _Base_ptr p_Var4;
  mapped_type *this_00;
  const_iterator __position;
  unique_lock<std::mutex> mapLock;
  positionTy posCam;
  unique_lock<std::mutex> local_128;
  LTChannel *local_118;
  double local_110;
  undefined1 local_108 [32];
  _Base_ptr local_e8;
  double local_e0;
  double dStack_d8;
  double local_d0;
  LTChannel *local_c8;
  double local_c0;
  double local_b8;
  positionTy local_78;
  
  local_118 = (LTChannel *)this;
  tVar3 = time((time_t *)0x0);
  DataRefs::GetViewPos();
  if ((_Rb_tree_header *)mapSynData._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &mapSynData._M_t._M_impl.super__Rb_tree_header) {
    local_110 = (double)(dataRefs.fdStdDistance * 0x73c) * (double)(dataRefs.fdStdDistance * 0x73c);
    __position._M_node = mapSynData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      dVar1 = DistLatLonSqr((double)__position._M_node[0xf]._M_parent,
                            (double)__position._M_node[0xf]._M_left,local_c0,local_b8);
      if (dVar1 <= local_110) {
        local_128._M_device = &mapFdMutex;
        local_128._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_128);
        local_128._M_owns = true;
        this_00 = std::
                  map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                  ::operator[](&mapFd,(key_type *)(__position._M_node + 1));
        std::unique_lock<std::mutex>::unlock(&local_128);
        pos = &__position._M_node[0xf]._M_parent;
        if (NAN((double)__position._M_node[0x10]._M_parent)) {
          LTAptFindStartupLoc((positionTy *)local_108,(positionTy *)pos,NAN,(double *)0x0);
          __position._M_node[0x10]._M_parent = local_e8;
          if (!NAN((double)local_e8) && !NAN((double)local_e8)) goto LAB_0019bd57;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<LTFlightData::FDKeyTy,_std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>,_std::_Select1st<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>_>
          ::_M_erase_aux(&mapSynData._M_t,__position);
        }
        else {
LAB_0019bd57:
          LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)local_108);
          local_c8 = local_118;
          local_e0 = 0.0;
          dStack_d8 = 0.0;
          local_108[0x18] = true;
          local_e8 = __position._M_node[0x10]._M_parent;
          *(ushort *)&__position._M_node[0x11].field_0x4 =
               (ushort)*(undefined4 *)&__position._M_node[0x11].field_0x4 & 0xcf00 | 0x1085;
          iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this_00->dataAccessMutex);
          if (iVar2 != 0) {
            std::__throw_system_error(iVar2);
          }
          if ((this_00->acKey).key._M_string_length == 0) {
            LTFlightData::SetKey(this_00,(key_type *)(__position._M_node + 1));
            DataRefs::GetViewPos();
            dVar1 = CoordDistance((positionTy *)pos,&local_78);
            LTFlightData::UpdateData
                      (this_00,(FDStaticData *)&__position._M_node[2]._M_left,dVar1,DATREQU_NONE);
            local_d0 = (double)tVar3 - (double)dataRefs.fdBufPeriod;
            *(double *)(__position._M_node + 0x10) = local_d0;
            LTFlightData::AddDynData(this_00,(FDDynamicData *)local_108,0,0,(positionTy *)pos);
            if ((int)dataRefs.iLogLevel < 1) {
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSynthetic.cpp"
                     ,0xdb,"ProcessFetchedData",logDEBUG,"Created parked aircraft %s",
                     __position._M_node[1]._M_parent);
            }
          }
          local_d0 = (double)tVar3 - (double)(dataRefs.fdCurrRefrIntvl / 2);
          *(double *)(__position._M_node + 0x10) = local_d0;
          LTFlightData::AddDynData(this_00,(FDDynamicData *)local_108,0,0,(positionTy *)pos);
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          pthread_mutex_unlock((pthread_mutex_t *)&this_00->dataAccessMutex);
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_128);
      }
      else {
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      __position._M_node = p_Var4;
    } while ((_Rb_tree_header *)p_Var4 != &mapSynData._M_t._M_impl.super__Rb_tree_header);
  }
  return true;
}

Assistant:

bool SyntheticConnection::ProcessFetchedData ()
{
    // Timestamp with which we send the data
    const double tNow = (double)std::time(nullptr);
    // Camera pos
    const positionTy posCam = dataRefs.GetViewPos();
    // Squared search distance for distance comparison
    const double distSearchSqr = sqr(double(dataRefs.GetFdStdDistance_m()));
    
    // --- Parked Aircraft ---
    // For all stored aircraft
    // - lookup heading to have them point into the right direction of the startup position
    // - send an dynamic data update for LiveTraffic to process
    for (auto i = mapSynData.begin(); i != mapSynData.end();) {
        const LTFlightData::FDKeyTy& key = i->first;
        SynDataTy& parkDat = i->second;

        // Only process planes in search distance
        // We keep the data in memory, just in case we come back, but we don't feed data for unneeded planes
        if (parkDat.pos.distRoughSqr(posCam) > distSearchSqr) {
            ++i;                                                // next plane
            continue;
        }

        // Find the related flight data
        std::unique_lock<std::mutex> mapLock (mapFdMutex);      // lock the entire map
        LTFlightData& fd = mapFd[key];                          // fetch or create flight data
        mapLock.unlock();                                       // release the map lock
        
        // Haven't yet looked up startup position's heading?
        if (std::isnan(parkDat.pos.heading())) {
            parkDat.pos.heading() = LTAptFindStartupLoc(parkDat.pos).heading();
            // Still have no heading? That means we don't have a startup position...should not happen but does
            if (std::isnan(parkDat.pos.heading()))
            {
                i = mapSynData.erase(i);
                continue;
            }
        }
        
        // Send position for LiveTraffic's processing
        LTFlightData::FDDynamicData dyn;
        dyn.pChannel = this;
        dyn.spd = 0.0;
        dyn.vsi = 0.0;
        dyn.gnd = true;
        dyn.heading = parkDat.pos.heading();
        parkDat.pos.f.specialPos = SPOS_STARTUP;
        parkDat.pos.f.bHeadFixed = true;
        parkDat.pos.f.flightPhase = FPH_PARKED;

        // Update flight data
        std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
        if (fd.key().empty()) {                                 // just created!
            // a/c exists no longer, we re-create it, can happen after disable/enable
            fd.SetKey(key);
            fd.UpdateData(parkDat.stat, parkDat.pos.dist(dataRefs.GetViewPos()));
            // to speed up creation of the actual aircraft we send the position for a past timestamp first
            dyn.ts = parkDat.pos.ts() = tNow - dataRefs.GetFdBufPeriod();
            fd.AddDynData(dyn, 0, 0, &parkDat.pos);
            LOG_MSG(logDEBUG, "Created parked aircraft %s", key.c_str());
        }

        // Add a (nearly) _current_ data item
        // We reduce timestamp a bit so we don't appear better than live stream's data,
        // which can't be current up to the minute
        dyn.ts = parkDat.pos.ts() = tNow - double(dataRefs.GetFdRefreshIntvl()/2);
        fd.AddDynData(dyn, 0, 0, &parkDat.pos);
        
        // next plane
        ++i;
    }
    return true;
}